

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight2.cpp
# Opt level: O2

void dfs_counts(int v)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  pointer piVar5;
  int __tmp;
  int *s;
  int *piVar6;
  
  subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[v] = 1
  ;
  piVar3 = G.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[v].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  for (piVar6 = G.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[v].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar6 != piVar3; piVar6 = piVar6 + 1) {
    par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [*piVar6] = v;
    depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [*piVar6] = depth.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[v] + 1;
    dfs_counts(*piVar6);
    piVar5 = subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[v] =
         subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [v] + subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[*piVar6];
    iVar1 = *piVar6;
    piVar4 = G.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[v].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    iVar2 = *piVar4;
    if (piVar5[iVar2] < piVar5[iVar1]) {
      *piVar6 = iVar2;
      *piVar4 = iVar1;
    }
  }
  return;
}

Assistant:

void dfs_counts(int v = 0) {
	subs[v] = 1;
	for (auto &s: G[v]) {
		par[s] = v, depth[s] = depth[v] + 1;
		dfs_counts(s);
		subs[v] += subs[s];
		if (subs[s] > subs[G[v][0]]) swap(s, G[v][0]);
	}
}